

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-after-read-timeout.c
# Opt level: O2

void on_client_timeout(uv_timer_t *handle)

{
  undefined8 uVar1;
  char *__format;
  char *pcVar2;
  char *pcVar3;
  uv_timer_t *puVar4;
  int64_t eval_b;
  int64_t eval_a;
  
  if (handle == &timer) {
    handle = (uv_timer_t *)(long)read_cb_called;
    if (handle == (uv_timer_t *)0x0) {
      uv_read_stop((uv_stream_t *)&client);
      uv_close((uv_handle_t *)&client,on_close);
      uv_close((uv_handle_t *)&timer,on_close);
      return;
    }
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
    pcVar2 = "read_cb_called";
    uVar1 = 0x4c;
    puVar4 = (uv_timer_t *)0x0;
    pcVar3 = "0";
  }
  else {
    __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
    pcVar2 = "handle";
    uVar1 = 0x4b;
    puVar4 = &timer;
    pcVar3 = "&timer";
  }
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-after-read-timeout.c"
          ,uVar1,pcVar2,"==",pcVar3,handle,"==",puVar4);
  abort();
}

Assistant:

static void on_client_timeout(uv_timer_t* handle) {
  ASSERT_PTR_EQ(handle, &timer);
  ASSERT_OK(read_cb_called);
  uv_read_stop((uv_stream_t*) &client);
  uv_close((uv_handle_t*) &client, on_close);
  uv_close((uv_handle_t*) &timer, on_close);
}